

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O0

ConvertAesResponseStruct *
cfd::js::api::UtilStructApi::ConvertAes
          (ConvertAesResponseStruct *__return_storage_ptr__,ConvertAesRequestStruct *request)

{
  ConvertAesRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  ConvertAesRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  ConvertAesRequestStruct *request_local;
  ConvertAesResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  ConvertAesResponseStruct::ConvertAesResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::ConvertAesResponseStruct(cfd::js::api::ConvertAesRequestStruct_const&)>::
  function<cfd::js::api::UtilStructApi::ConvertAes(cfd::js::api::ConvertAesRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::ConvertAesResponseStruct(cfd::js::api::ConvertAesRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"ConvertAes",&local_129);
  ExecuteStructApi<cfd::js::api::ConvertAesRequestStruct,cfd::js::api::ConvertAesResponseStruct>
            ((ConvertAesResponseStruct *)(local_108 + 0x20),(api *)this,
             (ConvertAesRequestStruct *)local_108,&local_128,in_R8);
  ConvertAesResponseStruct::operator=
            (__return_storage_ptr__,(ConvertAesResponseStruct *)(local_108 + 0x20));
  ConvertAesResponseStruct::~ConvertAesResponseStruct
            ((ConvertAesResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>::
  ~function((function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>
             *)local_108);
  return __return_storage_ptr__;
}

Assistant:

ConvertAesResponseStruct UtilStructApi::ConvertAes(
    const ConvertAesRequestStruct& request) {
  auto call_func =
      [](const ConvertAesRequestStruct& request) -> ConvertAesResponseStruct {
    ConvertAesResponseStruct result;
    ByteData data;

    if (request.is_encrypt) {
      data = CryptoUtil::EncryptAes256Cbc(
          ByteData(request.key), ByteData(request.iv), ByteData(request.data));
    } else {  // decrypto
      data = CryptoUtil::DecryptAes256Cbc(
          ByteData(request.key), ByteData(request.iv), ByteData(request.data));
    }

    result.hex = data.GetHex();
    return result;
  };

  ConvertAesResponseStruct result;
  result = ExecuteStructApi<ConvertAesRequestStruct, ConvertAesResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}